

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

VCFilter * __thiscall VCProjectSingleConfig::filterByName(VCProjectSingleConfig *this,QString *name)

{
  long lVar1;
  bool bVar2;
  QString *in_RSI;
  VCProjectSingleConfig *in_RDI;
  long in_FS_OFFSET;
  char **in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  VCProjectSingleConfig *this_00;
  VCFilter *local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar2) {
    local_60 = &in_RDI->RootFiles;
  }
  else {
    bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (bVar2) {
      local_60 = &in_RDI->SourceFiles;
    }
    else {
      bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (bVar2) {
        local_60 = &in_RDI->HeaderFiles;
      }
      else {
        bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        if (bVar2) {
          local_60 = &in_RDI->GeneratedFiles;
        }
        else {
          bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          if (bVar2) {
            local_60 = &in_RDI->LexYaccFiles;
          }
          else {
            bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            if (bVar2) {
              local_60 = &in_RDI->TranslationFiles;
            }
            else {
              bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
              if (bVar2) {
                local_60 = &in_RDI->FormFiles;
              }
              else {
                bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
                if (bVar2) {
                  local_60 = &in_RDI->ResourceFiles;
                }
                else {
                  bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
                  if (bVar2) {
                    local_60 = &in_RDI->DeploymentFiles;
                  }
                  else {
                    bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
                    if (bVar2) {
                      local_60 = &in_RDI->DistributionFiles;
                    }
                    else {
                      local_60 = filterForExtraCompiler(this_00,in_RSI);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_60;
  }
  __stack_chk_fail();
}

Assistant:

const VCFilter &VCProjectSingleConfig::filterByName(const QString &name) const
{
    if (name == "Root Files")
        return RootFiles;
    if (name == "Source Files")
        return SourceFiles;
    if (name == "Header Files")
        return HeaderFiles;
    if (name == "Generated Files")
        return GeneratedFiles;
    if (name == "LexYacc Files")
        return LexYaccFiles;
    if (name == "Translation Files")
        return TranslationFiles;
    if (name == "Form Files")
        return FormFiles;
    if (name == "Resource Files")
        return ResourceFiles;
    if (name == "Deployment Files")
        return DeploymentFiles;
    if (name == "Distribution Files")
        return DistributionFiles;
    return filterForExtraCompiler(name);
}